

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O0

Value * duckdb::MultiFileReader::CreateValueFromFileList
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   *file_list)

{
  bool bVar1;
  reference pbVar2;
  vector<duckdb::Value,_true> *in_RSI;
  Value *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *__range1;
  vector<duckdb::Value,_true> files;
  value_type *in_stack_fffffffffffffef8;
  Value *in_stack_ffffffffffffff00;
  LogicalTypeId in_stack_ffffffffffffff1f;
  pointer in_stack_ffffffffffffff20;
  string local_a8 [32];
  string *in_stack_ffffffffffffff78;
  Value *in_stack_ffffffffffffff80;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  LogicalType *in_stack_ffffffffffffffd8;
  
  vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x1556e31);
  local_38._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffef8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_fffffffffffffef8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffff00,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffef8);
    if (!bVar1) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_38);
    ::std::__cxx11::string::string(local_a8,(string *)pbVar2);
    Value::Value(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)in_stack_ffffffffffffff00,
               in_stack_fffffffffffffef8);
    Value::~Value(in_stack_ffffffffffffff00);
    ::std::__cxx11::string::~string(local_a8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_38);
  }
  LogicalType::LogicalType(&in_stack_ffffffffffffff20->type_,in_stack_ffffffffffffff1f);
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)&stack0xffffffffffffff18,
             (vector<duckdb::Value,_true> *)in_stack_fffffffffffffef8);
  Value::LIST(in_stack_ffffffffffffffd8,in_RSI);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1556f9b);
  LogicalType::~LogicalType((LogicalType *)0x1556fa5);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1556fb2);
  return in_RDI;
}

Assistant:

Value MultiFileReader::CreateValueFromFileList(const vector<string> &file_list) {
	vector<Value> files;
	for (auto &file : file_list) {
		files.push_back(file);
	}
	return Value::LIST(LogicalType::VARCHAR, std::move(files));
}